

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void QPDF::compute_encryption_O_U
               (char *user_password,char *owner_password,int V,int R,int key_len,int P,
               bool encrypt_metadata,string *id1,string *O,string *U)

{
  uchar *data_00;
  logic_error *this;
  ulong uVar1;
  int iterations;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  char upass [32];
  string local_170;
  undefined1 local_150 [32];
  size_type __dnew;
  char *local_128;
  char *local_120;
  uchar O_key [16];
  EncryptionData data;
  
  local_128 = user_password;
  local_120 = owner_password;
  if (V < 5) {
    upass._0_8_ = upass + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)upass,"");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"");
    EncryptionData::EncryptionData
              (&data,V,R,key_len,P,(string *)upass,&local_1d8,&local_1b8,&local_170,
               (string *)local_150,id1,encrypt_metadata);
    if ((string *)local_150._0_8_ != (string *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((char *)upass._0_8_ != upass + 0x10) {
      operator_delete((void *)upass._0_8_,upass._16_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,local_128,&local_1d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_150,local_120,&local_1da);
    compute_O_rc4_key(&local_170,(string *)local_150._0_8_,(EncryptionData *)local_150._8_8_,
                      (uchar *)&data);
    if (0x1f < local_170._M_string_length) {
      local_170._M_string_length = 0x20;
    }
    memcpy(upass,local_170._M_dataplus._M_p,local_170._M_string_length);
    memcpy(upass + local_170._M_string_length,padding_string,0x20 - local_170._M_string_length);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    __dnew = 0x10;
    local_1d8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1d8,(ulong)&__dnew);
    local_1d8.field_2._M_allocated_capacity = __dnew;
    *(undefined8 *)local_1d8._M_dataplus._M_p = O_key._0_8_;
    *(undefined8 *)((uchar *)local_1d8._M_dataplus._M_p + 8) = O_key._8_8_;
    local_1d8._M_string_length = __dnew;
    ((uchar *)local_1d8._M_dataplus._M_p)[__dnew] = '\0';
    uVar1 = (ulong)data.Length_bytes;
    if ((long)uVar1 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data.Length_bytes);
    }
    if (local_1d8._M_string_length <= uVar1 && uVar1 - local_1d8._M_string_length != 0) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_1d8,local_1d8._M_string_length,0,
                 (char)(uVar1 - local_1d8._M_string_length));
    }
    data_00 = QUtil::unsigned_char_pointer(upass);
    iterations = 1;
    if (2 < data.R) {
      iterations = 0x14;
    }
    iterate_rc4(data_00,0x20,O_key,data.Length_bytes,iterations,false);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    __dnew = 0x20;
    local_1b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1b8,(ulong)&__dnew);
    local_1b8.field_2._M_allocated_capacity = __dnew;
    *(undefined8 *)(local_1b8._M_dataplus._M_p + 0x10) = upass._16_8_;
    *(undefined8 *)(local_1b8._M_dataplus._M_p + 0x18) = upass._24_8_;
    *(undefined8 *)local_1b8._M_dataplus._M_p = upass._0_8_;
    *(undefined8 *)(local_1b8._M_dataplus._M_p + 8) = upass._8_8_;
    local_1b8._M_string_length = __dnew;
    local_1b8._M_dataplus._M_p[__dnew] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&data.O);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_150._0_8_ != (string *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)O);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_128,(allocator<char> *)&local_1b8);
    compute_U_value((string *)upass,&local_1d8,&data);
    std::__cxx11::string::_M_assign((string *)&data.U);
    if ((char *)upass._0_8_ != upass + 0x10) {
      operator_delete((void *)upass._0_8_,upass._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)U);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.id1._M_dataplus._M_p != &data.id1.field_2) {
      operator_delete(data.id1._M_dataplus._M_p,data.id1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.Perms._M_dataplus._M_p != &data.Perms.field_2) {
      operator_delete(data.Perms._M_dataplus._M_p,data.Perms.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.UE._M_dataplus._M_p != &data.UE.field_2) {
      operator_delete(data.UE._M_dataplus._M_p,data.UE.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.OE._M_dataplus._M_p != &data.OE.field_2) {
      operator_delete(data.OE._M_dataplus._M_p,data.OE.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.U._M_dataplus._M_p != &data.U.field_2) {
      operator_delete(data.U._M_dataplus._M_p,data.U.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.O._M_dataplus._M_p != &data.O.field_2) {
      operator_delete(data.O._M_dataplus._M_p,data.O.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_encryption_O_U called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::compute_encryption_O_U(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    int P,
    bool encrypt_metadata,
    std::string const& id1,
    std::string& O,
    std::string& U)
{
    if (V >= 5) {
        throw std::logic_error("compute_encryption_O_U called for file with V >= 5");
    }
    EncryptionData data(V, R, key_len, P, "", "", "", "", "", id1, encrypt_metadata);
    data.setO(compute_O_value(user_password, owner_password, data));
    O = data.getO();
    data.setU(compute_U_value(user_password, data));
    U = data.getU();
}